

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<unsigned_int,3ul>>
          (Attribute *this,array<unsigned_int,_3UL> *v)

{
  value_type *pvVar1;
  optional<std::array<unsigned_int,_3UL>_> ret;
  optional<std::array<unsigned_int,_3UL>_> local_38;
  optional<std::array<unsigned_int,_3UL>_> local_28;
  
  if (v == (array<unsigned_int,_3UL> *)0x0) {
    local_38.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<unsigned_int,3ul>>(&local_38,&this->_var);
    local_28.has_value_ = local_38.has_value_;
    if (local_38.has_value_ != false) {
      local_28.contained._8_4_ = local_38.contained._8_4_;
      local_28.contained._0_8_ = local_38.contained._0_8_;
      pvVar1 = nonstd::optional_lite::optional<std::array<unsigned_int,_3UL>_>::value(&local_28);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar1->_M_elems;
      v->_M_elems[2] = pvVar1->_M_elems[2];
    }
  }
  return local_38.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }